

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,LetStmt *node)

{
  pointer pIVar1;
  pointer pEVar2;
  ostream *this_00;
  LetStmt *node_local;
  PrettyPrinter *this_local;
  
  std::operator<<((ostream *)&std::cout,"let ");
  pIVar1 = std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>::operator->
                     (&node->m_ident);
  (*(pIVar1->super_Expr).super_Stmt._vptr_Stmt[2])(pIVar1,this);
  std::operator<<((ostream *)&std::cout," be ");
  pEVar2 = std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::operator->(&node->m_expr);
  (*(pEVar2->super_Stmt)._vptr_Stmt[2])(pEVar2,this);
  this_00 = std::operator<<((ostream *)&std::cout,";");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrettyPrinter::visit(AST::LetStmt *node) {
    std::cout << "let ";
    node->m_ident->accept(this);
    std::cout << " be ";
    node->m_expr->accept(this);
    std::cout << ";" << std::endl;
}